

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchingFunction.cpp
# Opt level: O3

void __thiscall
OpenMD::SwitchingFunction::setSwitchType(SwitchingFunction *this,SwitchingFunctionType sft)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CubicSpline *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  CubicSpline *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if (sft < 2) {
    if (this->haveSpline_ == true) {
      local_28 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
                (a_Stack_20,&local_28,(allocator<OpenMD::CubicSpline> *)&local_29);
      _Var2._M_pi = a_Stack_20[0]._M_pi;
      pCVar1 = local_28;
      local_28 = (CubicSpline *)0x0;
      a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->switchSpline_).
                super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pCVar1;
      (this->switchSpline_).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var2._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
        }
      }
      setSwitch(this,this->rin_,this->rout_);
    }
    return;
  }
  memcpy(&painCave,"SwitchingFunction::setSwitchType was given unknown function type\n",0x42);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return;
}

Assistant:

void SwitchingFunction::setSwitchType(SwitchingFunctionType sft) {
    if ((sft == fifth_order_poly) || (sft == cubic)) {
      if (haveSpline_) {
        switchSpline_ = std::make_shared<CubicSpline>();
        setSwitch(rin_, rout_);
      }
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SwitchingFunction::setSwitchType was given unknown function type\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }